

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O0

int AF_AStateProvider_A_GunFlash
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  AWeapon *pAVar1;
  int iVar2;
  MetaClass *pMVar3;
  VMValue *pVVar4;
  bool bVar5;
  bool local_76;
  bool local_73;
  FName local_70;
  FName local_6c;
  player_t *local_68;
  player_t *player;
  FState *pFStack_58;
  int flags;
  FState *flash;
  FStateParamInfo *stateinfo;
  AStateProvider *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  TArray<VMValue,_VMValue> *pTStack_20;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  self._0_4_ = 0;
  self._4_4_ = numret;
  _paramnum = ret;
  ret_local._4_4_ = numparam;
  pTStack_20 = defaultparam;
  defaultparam_local = (TArray<VMValue,_VMValue> *)param;
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x560,
                  "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar5 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar5 = true, (param->field_0).field_1.atag != 1)) {
    bVar5 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar5) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x560,
                  "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  stateowner = (AStateProvider *)(param->field_0).field_1.a;
  local_73 = true;
  if ((DObject *)stateowner != (DObject *)0x0) {
    local_73 = DObject::IsKindOf((DObject *)stateowner,AActor::RegistrationInfo.MyClass);
  }
  if (local_73 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x560,
                  "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  self._0_4_ = (int)self + 1;
  if (ret_local._4_4_ <= (int)self) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                  ,0x560,
                  "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  bVar5 = false;
  if (((char)defaultparam_local[(int)self].Count == '\x03') &&
     (bVar5 = true, defaultparam_local[(int)self].Most != 1)) {
    bVar5 = defaultparam_local[(int)self].Array == (VMValue *)0x0;
  }
  if (bVar5) {
    stateinfo = (FStateParamInfo *)defaultparam_local[(int)self].Array;
    local_76 = true;
    if ((DObject *)stateinfo != (DObject *)0x0) {
      local_76 = DObject::IsKindOf((DObject *)stateinfo,AStateProvider::RegistrationInfo.MyClass);
    }
    if (local_76 == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                    ,0x560,
                    "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    iVar2 = (int)self + 1;
    if (ret_local._4_4_ <= iVar2) {
      self._0_4_ = iVar2;
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                    ,0x560,
                    "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if ((char)defaultparam_local[iVar2].Count != '\x03') {
      self._0_4_ = iVar2;
      __assert_fail("param[paramnum].Type == REGT_POINTER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                    ,0x560,
                    "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    flash = (FState *)defaultparam_local[iVar2].Array;
    self._0_4_ = (int)self + 2;
    if ((int)self < ret_local._4_4_) {
      if ((char)defaultparam_local[(int)self].Count != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                      ,0x561,
                      "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar2 = *(int *)&defaultparam_local[(int)self].Array;
      pMVar3 = AInventory::GetClass((AInventory *)stateinfo);
      pFStack_58 = FStateLabelStorage::GetState(&StateLabels,iVar2,&pMVar3->super_PClassActor,false)
      ;
    }
    else {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                      ,0x561,
                      "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
      iVar2 = (pVVar4->field_0).i;
      pMVar3 = AInventory::GetClass((AInventory *)stateinfo);
      pFStack_58 = FStateLabelStorage::GetState(&StateLabels,iVar2,&pMVar3->super_PClassActor,false)
      ;
    }
    self._0_4_ = (int)self + 1;
    if ((int)self < ret_local._4_4_) {
      if ((char)defaultparam_local[(int)self].Count != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                      ,0x562,
                      "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      player._4_4_ = *(uint *)&defaultparam_local[(int)self].Array;
    }
    else {
      pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
      if ((pVVar4->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                      ,0x562,
                      "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar4 = TArray<VMValue,_VMValue>::operator[](pTStack_20,(long)(int)self);
      player._4_4_ = (pVVar4->field_0).i;
    }
    local_68 = (stateowner->super_AInventory).super_AActor.player;
    if (local_68 != (player_t *)0x0) {
      if ((player._4_4_ & 1) == 0) {
        APlayerPawn::PlayAttacking2(local_68->mo);
      }
      if (pFStack_58 == (FState *)0x0) {
        if ((local_68->ReadyWeapon->bAltFire & 1U) != 0) {
          pAVar1 = local_68->ReadyWeapon;
          FName::FName(&local_6c,NAME_AltFlash);
          pFStack_58 = AActor::FindState((AActor *)pAVar1,&local_6c);
        }
        if (pFStack_58 == (FState *)0x0) {
          pAVar1 = local_68->ReadyWeapon;
          FName::FName(&local_70,NAME_Flash);
          pFStack_58 = AActor::FindState((AActor *)pAVar1,&local_70);
        }
      }
      P_SetPsprite(local_68,PSP_FLASH,pFStack_58,false);
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_pspr.cpp"
                ,0x560,
                "int AF_AStateProvider_A_GunFlash(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_GunFlash)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_STATE_ACTION_DEF(flash);
	PARAM_INT_DEF(flags);

	player_t *player = self->player;

	if (nullptr == player)
	{
		return 0;
	}
	if (!(flags & GFF_NOEXTCHANGE))
	{
		player->mo->PlayAttacking2 ();
	}
	if (flash == nullptr)
	{
		if (player->ReadyWeapon->bAltFire)
		{
			flash = player->ReadyWeapon->FindState(NAME_AltFlash);
		}
		if (flash == nullptr)
		{
			flash = player->ReadyWeapon->FindState(NAME_Flash);
		}
	}
	P_SetPsprite(player, PSP_FLASH, flash);
	return 0;
}